

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkPointFrameGeneric::IntLoadConstraint_C
          (ChLinkPointFrameGeneric *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  element_type *peVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  Scalar *pSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM1_Qb;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_e0;
  ChVector<double> res;
  undefined1 local_b8 [16];
  double local_a8;
  ChVector<double> v;
  ChMatrix33<double> Arw;
  
  iVar4 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar4 != '\0') {
    ChQuaternion<double>::operator>>
              ((ChQuaternion<double> *)&res,&(this->m_csys).rot,
               &(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
    ChMatrix33<double>::Set_A_quaternion(&Arw,(ChQuaternion<double> *)&res);
    peVar1 = (this->m_node).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0.m_matrix = &Arw.super_Matrix<double,_3,_3,_1,_3,_3>;
    ChFrame<double>::TransformPointLocalToParent
              ((ChVector<double> *)local_b8,
               (ChFrame<double> *)
               (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&(this->m_csys).pos);
    v.m_data._0_16_ =
         vsubpd_avx(*(undefined1 (*) [16])&(peVar1->super_ChNodeFEAbase).field_0x20,local_b8);
    v.m_data[2] = *(double *)&peVar1->field_0x30 - local_a8;
    chrono::operator*(&local_e0,&v);
    dVar8 = c * res.m_data[0];
    auVar10._0_8_ = c * res.m_data[1];
    auVar10._8_8_ = c * res.m_data[2];
    if (do_clamp) {
      auVar3._8_8_ = in_XMM1_Qb;
      auVar3._0_8_ = recovery_clamp;
      auVar7._8_8_ = recovery_clamp;
      auVar7._0_8_ = recovery_clamp;
      auVar2._8_8_ = 0x8000000000000000;
      auVar2._0_8_ = 0x8000000000000000;
      auVar6 = vxorpd_avx512vl(auVar7,auVar2);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = dVar8;
      auVar2 = vmaxsd_avx(auVar9,auVar6);
      auVar6._8_8_ = auVar6._0_8_;
      auVar10 = vmaxpd_avx(auVar10,auVar6);
      auVar2 = vminsd_avx(auVar2,auVar3);
      dVar8 = auVar2._0_8_;
      auVar10 = vminpd_avx(auVar10,auVar7);
    }
    iVar4 = 0;
    if ((this->c_x == true) &&
       ((this->constraint1).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                          (ulong)off_L);
      *pSVar5 = dVar8 + *pSVar5;
      iVar4 = 1;
    }
    if ((this->c_y == true) &&
       ((this->constraint2).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                          (ulong)(iVar4 + off_L));
      iVar4 = iVar4 + 1;
      *pSVar5 = auVar10._0_8_ + *pSVar5;
    }
    if ((this->c_z == true) &&
       ((this->constraint3).super_ChConstraintTwo.super_ChConstraint.active == true)) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                          (ulong)(iVar4 + off_L));
      auVar10 = vpermilpd_avx(auVar10,1);
      *pSVar5 = auVar10._0_8_ + *pSVar5;
    }
  }
  return;
}

Assistant:

void ChLinkPointFrameGeneric::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                                  ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                                  const double c,            // a scaling factor
                                                  bool do_clamp,             // apply clamping to c*C?
                                                  double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    ChMatrix33<> Arw(m_csys.rot >> m_body->GetRot());

    ChVector<> res = Arw.transpose() * (m_node->GetPos() - m_body->TransformPointLocalToParent(m_csys.pos));
    ChVector<> cres = res * c;

    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }

    int cnt = 0;
    if (c_x && this->constraint1.IsActive()) {
        Qc(off_L + cnt) += cres.x();
        cnt++;
    }
    if (c_y && this->constraint2.IsActive()) {
        Qc(off_L + cnt) += cres.y();
        cnt++;
    }
    if (c_z && this->constraint3.IsActive()) {
        Qc(off_L + cnt) += cres.z();
        // cnt++;
    }
}